

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_slice.cpp
# Opt level: O0

ScalarFunctionSet * duckdb::ListSliceFun::GetFunctions(void)

{
  initializer_list<duckdb::LogicalType> iVar1;
  ScalarFunctionSet *in_RDI;
  ScalarFunction fun;
  ScalarFunctionSet *set;
  allocator_type *in_stack_fffffffffffffa48;
  ScalarFunction *function;
  vector<duckdb::LogicalType,_true> *in_stack_fffffffffffffa50;
  ScalarFunction *this;
  _func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr *in_stack_fffffffffffffa58;
  undefined4 in_stack_fffffffffffffa60;
  undefined4 in_stack_fffffffffffffa64;
  undefined4 uVar2;
  undefined4 in_stack_fffffffffffffa6c;
  ScalarFunction *this_00;
  LogicalType *local_548;
  LogicalType local_400 [327];
  undefined1 local_2b9;
  BaseScalarFunction local_2b8 [176];
  LogicalType local_208 [24];
  undefined1 local_1f0 [32];
  LogicalType local_1d0 [40];
  LogicalType *local_1a8;
  LogicalType local_1a0 [24];
  LogicalType local_188 [24];
  LogicalType local_170 [24];
  LogicalType *local_158;
  undefined8 local_150;
  undefined1 local_148 [24];
  ScalarFunction local_130;
  
  local_1a8 = local_1a0;
  duckdb::LogicalType::LogicalType(local_1a8,ANY);
  local_1a8 = local_188;
  duckdb::LogicalType::LogicalType(local_1a8,ANY);
  local_1a8 = local_170;
  duckdb::LogicalType::LogicalType(local_1a8,ANY);
  local_158 = local_1a0;
  local_150 = 3;
  std::allocator<duckdb::LogicalType>::allocator((allocator<duckdb::LogicalType> *)0xd545e4);
  iVar1._M_len._0_4_ = in_stack_fffffffffffffa60;
  iVar1._M_array = (iterator)in_stack_fffffffffffffa58;
  iVar1._M_len._4_4_ = in_stack_fffffffffffffa64;
  vector<duckdb::LogicalType,_true>::vector
            (in_stack_fffffffffffffa50,iVar1,in_stack_fffffffffffffa48);
  duckdb::LogicalType::LogicalType(local_1d0,ANY);
  std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::
  function<void(&)(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&),void>
            ((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
             CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60),in_stack_fffffffffffffa58
            );
  duckdb::LogicalType::LogicalType(local_208,INVALID);
  this_00 = (ScalarFunction *)0x0;
  uVar2 = 0;
  this = (ScalarFunction *)0x0;
  function = (ScalarFunction *)0x0;
  duckdb::ScalarFunction::ScalarFunction
            (&local_130,local_148,local_1d0,local_1f0,ArraySliceBind,0,0,0,local_208,0);
  duckdb::LogicalType::~LogicalType(local_208);
  std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::~function
            ((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
             0xd546c2);
  duckdb::LogicalType::~LogicalType(local_1d0);
  vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0xd546dc);
  std::allocator<duckdb::LogicalType>::~allocator((allocator<duckdb::LogicalType> *)0xd546e9);
  local_548 = (LogicalType *)&local_158;
  do {
    local_548 = local_548 + -0x18;
    duckdb::LogicalType::~LogicalType(local_548);
  } while (local_548 != local_1a0);
  local_130._169_1_ = 1;
  BaseScalarFunction::SetReturnsError(&function->super_BaseScalarFunction);
  duckdb::BaseScalarFunction::~BaseScalarFunction(local_2b8);
  local_2b9 = 0;
  duckdb::ScalarFunctionSet::ScalarFunctionSet(in_RDI);
  ScalarFunction::ScalarFunction
            (this_00,(ScalarFunction *)CONCAT44(in_stack_fffffffffffffa6c,uVar2));
  FunctionSet<duckdb::ScalarFunction>::AddFunction
            ((FunctionSet<duckdb::ScalarFunction> *)this,function);
  ScalarFunction::~ScalarFunction(this);
  duckdb::LogicalType::LogicalType(local_400,BIGINT);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)this,
             (value_type *)function);
  duckdb::LogicalType::~LogicalType(local_400);
  ScalarFunction::ScalarFunction
            (this_00,(ScalarFunction *)CONCAT44(in_stack_fffffffffffffa6c,uVar2));
  FunctionSet<duckdb::ScalarFunction>::AddFunction
            ((FunctionSet<duckdb::ScalarFunction> *)this,function);
  ScalarFunction::~ScalarFunction(this);
  local_2b9 = 1;
  ScalarFunction::~ScalarFunction(this);
  return in_RDI;
}

Assistant:

ScalarFunctionSet ListSliceFun::GetFunctions() {
	// the arguments and return types are actually set in the binder function
	ScalarFunction fun({LogicalType::ANY, LogicalType::ANY, LogicalType::ANY}, LogicalType::ANY, ArraySliceFunction,
	                   ArraySliceBind);
	fun.null_handling = FunctionNullHandling::SPECIAL_HANDLING;
	BaseScalarFunction::SetReturnsError(fun);
	ScalarFunctionSet set;
	set.AddFunction(fun);
	fun.arguments.push_back(LogicalType::BIGINT);
	set.AddFunction(fun);
	return set;
}